

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * strGetOption_abi_cxx11_(string *__return_storage_ptr__,char *message)

{
  char cVar1;
  size_t sVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (message == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x110160);
  }
  else {
    sVar2 = strlen(message);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,message,sVar2);
  }
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\b');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__,cVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string strGetOption(const char *message){
	std::string temp;
	std::cout << message;
	std::getline(std::cin, temp);
	return temp;
}